

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::PipelineCreateInfo::ViewportState::ViewportState
          (ViewportState *this,deUint32 _viewportCount,
          vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *_viewports,
          vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *_scissors)

{
  pointer __s;
  pointer pVVar1;
  
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_VkPipelineViewportStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  (this->super_VkPipelineViewportStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineViewportStateCreateInfo).flags = 0;
  (this->super_VkPipelineViewportStateCreateInfo).viewportCount = _viewportCount;
  (this->super_VkPipelineViewportStateCreateInfo).scissorCount = _viewportCount;
  if ((_viewports->super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (_viewports->super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::resize
              (&this->m_viewports,(ulong)_viewportCount);
    __s = (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
          _M_impl.super__Vector_impl_data._M_start;
    memset(__s,0,(long)(this->m_viewports).
                       super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)__s);
  }
  else {
    std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator=
              (&this->m_viewports,_viewports);
  }
  if ((_scissors->super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (_scissors->super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::resize
              (&this->m_scissors,(ulong)(this->super_VkPipelineViewportStateCreateInfo).scissorCount
              );
    pVVar1 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
             _M_impl.super__Vector_impl_data._M_start;
    memset(pVVar1,0,(long)(this->m_scissors).
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pVVar1);
  }
  else {
    std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator=(&this->m_scissors,_scissors)
    ;
  }
  pVVar1 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pScissors = pVVar1;
  return;
}

Assistant:

PipelineCreateInfo::ViewportState::ViewportState (deUint32						_viewportCount,
												  std::vector<vk::VkViewport>	_viewports,
												  std::vector<vk::VkRect2D>		_scissors)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags			= 0u;
	viewportCount	= _viewportCount;
	scissorCount	= _viewportCount;

	if (!_viewports.size())
	{
		m_viewports.resize(viewportCount);
		deMemset(&m_viewports[0], 0, sizeof(m_viewports[0]) * m_viewports.size());
	}
	else
	{
		m_viewports = _viewports;
	}

	if (!_scissors.size())
	{
		m_scissors.resize(scissorCount);
		deMemset(&m_scissors[0], 0, sizeof(m_scissors[0]) * m_scissors.size());
	}
	else
	{
		m_scissors = _scissors;
	}

	pViewports	= &m_viewports[0];
	pScissors	= &m_scissors[0];
}